

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BReverbModel.cpp
# Opt level: O2

bool __thiscall MT32Emu::BReverbModelImpl<float>::isActive(BReverbModelImpl<float> *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Bit32u i;
  ulong uVar4;
  
  iVar3 = (*(this->super_BReverbModel)._vptr_BReverbModel[2])();
  if ((char)iVar3 == '\0') {
    return false;
  }
  uVar4 = 0;
  do {
    if (this->currentSettings->numberOfAllpasses <= uVar4) {
      uVar4 = 0;
      do {
        bVar1 = uVar4 < this->currentSettings->numberOfCombs;
        if (!bVar1) {
          return bVar1;
        }
        bVar2 = RingBuffer<float>::isEmpty(&this->combs[uVar4]->super_RingBuffer<float>);
        uVar4 = uVar4 + 1;
      } while (bVar2);
      return bVar1;
    }
    bVar1 = RingBuffer<float>::isEmpty(&this->allpasses[uVar4]->super_RingBuffer<float>);
    uVar4 = uVar4 + 1;
  } while (bVar1);
  return true;
}

Assistant:

bool isActive() const {
		if (!isOpen()) return false;
		for (Bit32u i = 0; i < currentSettings.numberOfAllpasses; i++) {
			if (!allpasses[i]->isEmpty()) return true;
		}
		for (Bit32u i = 0; i < currentSettings.numberOfCombs; i++) {
			if (!combs[i]->isEmpty()) return true;
		}
		return false;
	}